

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  string *psVar2;
  ulong uVar3;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined1 local_19;
  cmCommonTargetGenerator *local_18;
  cmCommonTargetGenerator *this_local;
  string *compilePdbPath;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmCommonTargetGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  if ((int)TVar1 < 5) {
    this_00 = this->GeneratorTarget;
    psVar2 = GetConfigName_abi_cxx11_(this);
    cmGeneratorTarget::GetCompilePDBPath(&local_50,this_00,psVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_90,this->GeneratorTarget);
      std::operator+(&local_70,&local_90,"/");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
      if (TVar1 == STATIC_LIBRARY) {
        psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".pdb");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeTargetCompilePDB() const
{
  std::string compilePdbPath;
  if (this->GeneratorTarget->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    return compilePdbPath;
  }
  compilePdbPath =
    this->GeneratorTarget->GetCompilePDBPath(this->GetConfigName());
  if (compilePdbPath.empty()) {
    // Match VS default: `$(IntDir)vc$(PlatformToolsetVersion).pdb`.
    // A trailing slash tells the toolchain to add its default file name.
    compilePdbPath = this->GeneratorTarget->GetSupportDirectory() + "/";
    if (this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY) {
      // Match VS default for static libs: `$(IntDir)$(ProjectName).pdb`.
      compilePdbPath += this->GeneratorTarget->GetName();
      compilePdbPath += ".pdb";
    }
  }

  return compilePdbPath;
}